

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonSplitFormatter.cpp
# Opt level: O2

ostream * __thiscall
cali::JsonSplitFormatter::JsonSplitFormatterImpl::write_column_metadata
          (JsonSplitFormatterImpl *this,ostream *os,Column *column,
          CaliperMetadataAccessInterface *db)

{
  pointer pAVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  cali_id_t cVar8;
  Attribute attr;
  Variant local_68;
  string local_50;
  long *plVar6;
  
  poVar5 = std::operator<<(os,"\"is_value\": ");
  pcVar7 = "true";
  if (column->is_hierarchy != false) {
    pcVar7 = "false";
  }
  std::operator<<(poVar5,pcVar7);
  pAVar1 = (column->attributes).
           super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(column->attributes).
            super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pAVar1 == 8) {
    pNVar2 = pAVar1->m_node;
    if (pNVar2 == (Node *)0x0) {
      cVar8 = 0xffffffffffffffff;
    }
    else {
      cVar8 = pNVar2->m_id;
    }
    iVar4 = (**db->_vptr_CaliperMetadataAccessInterface)(db,cVar8);
    plVar6 = (long *)CONCAT44(extraout_var,iVar4);
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = *(long **)(*plVar6 + plVar6[1]);
    }
    for (; (plVar6 != (long *)0x0 && (plVar6[2] != -1)); plVar6 = *(long **)(*plVar6 + plVar6[1])) {
      iVar4 = (*db->_vptr_CaliperMetadataAccessInterface[1])(db,plVar6[6]);
      attr.m_node = (Node *)CONCAT44(extraout_var_00,iVar4);
      if ((attr.m_node == (Node *)0x0) || (0xb < (attr.m_node)->m_id)) {
        bVar3 = Attribute::is_hidden(&attr);
        if (!bVar3) {
          poVar5 = std::operator<<(os,", \"");
          pcVar7 = Attribute::name_c_str(&attr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,pcVar7,(allocator<char> *)&local_68);
          poVar5 = util::write_json_esc_string(poVar5,&local_50);
          std::operator<<(poVar5,"\": ");
          std::__cxx11::string::~string((string *)&local_50);
          poVar5 = std::operator<<(os,"\"");
          local_68.m_v.type_and_size = plVar6[7];
          local_68.m_v.value = *(anon_union_8_7_33918203_for_value *)(plVar6 + 8);
          Variant::to_string_abi_cxx11_(&local_50,&local_68);
          poVar5 = util::write_json_esc_string(poVar5,&local_50);
          std::operator<<(poVar5,"\"");
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  return os;
}

Assistant:

std::ostream& write_column_metadata(std::ostream& os, const Column& column, CaliperMetadataAccessInterface& db)
    {
        os << "\"is_value\": " << (column.is_hierarchy ? "false" : "true");

        // for single-attribute columns (i.e. not "path"), write metadata
        if (column.attributes.size() == 1) {
            const Node* node = db.node(column.attributes.front().id());

            if (node)
                node = node->parent();

            for (; node && node->id() != CALI_INV_ID; node = node->parent()) {
                Attribute attr = db.get_attribute(node->attribute());

                // skip bootstrap info and hidden attributes
                if (attr.id() < 12 || attr.is_hidden())
                    continue;

                util::write_json_esc_string(os << ", \"", attr.name_c_str()) << "\": ";
                util::write_json_esc_string(os << "\"", node->data().to_string()) << "\"";
            }
        }

        return os;
    }